

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O3

ChFrame<double> * __thiscall
chrono::ChFrame<double>::operator>>=(ChFrame<double> *this,ChQuaternion<double> *R)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ChVector<double> local_40;
  ChQuaternion<double> local_28;
  
  dVar1 = R->m_data[0];
  auVar13._8_8_ = dVar1;
  auVar13._0_8_ = dVar1;
  auVar17._16_8_ = dVar1;
  auVar17._0_16_ = auVar13;
  auVar17._24_8_ = dVar1;
  auVar5 = *(undefined1 (*) [16])(R->m_data + 2);
  dVar2 = R->m_data[1];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar2;
  dVar3 = R->m_data[3];
  auVar32._8_8_ = dVar3;
  auVar32._0_8_ = dVar3;
  auVar22 = ZEXT816(0xbff0000000000000);
  auVar24 = ZEXT816(0x4000000000000000);
  dVar4 = (this->coord).pos.m_data[1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar4;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = (this->coord).pos.m_data[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (this->coord).pos.m_data[2];
  dVar30 = auVar5._0_8_;
  auVar8 = vmulsd_avx512f(auVar15,auVar5);
  auVar9 = vmulsd_avx512f(auVar5,auVar32);
  auVar10 = vmulsd_avx512f(auVar15,auVar32);
  dVar6 = dVar1 * dVar1;
  auVar11 = vmulsd_avx512f(auVar13,auVar32);
  auVar12 = vmulsd_avx512f(auVar13,auVar5);
  auVar13 = vsubsd_avx512f(auVar8,auVar11);
  auVar14 = vaddsd_avx512f(auVar8,auVar11);
  auVar20._0_8_ = -dVar2;
  auVar20._8_8_ = 0x8000000000000000;
  auVar8 = vunpcklpd_avx(auVar20,auVar15);
  auVar21._16_16_ = auVar5;
  auVar21._0_16_ = auVar8;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar30 * dVar30 + dVar6;
  auVar11 = vfmadd213sd_fma(auVar16,auVar24,auVar22);
  auVar15 = vaddsd_avx512f(auVar14,auVar14);
  auVar16 = vaddsd_avx512f(auVar13,auVar13);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar6 + dVar2 * dVar2;
  auVar13 = vfmadd213sd_fma(auVar23,auVar24,auVar22);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3 * dVar3 + dVar6;
  auVar14 = vfmadd213sd_fma(auVar14,auVar24,auVar22);
  auVar16 = vmulsd_avx512f(auVar28,auVar16);
  auVar13 = vfmadd231sd_avx512f(auVar16,auVar27,auVar13);
  auVar16 = vaddsd_avx512f(auVar12,auVar10);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar11._0_8_ * dVar4;
  auVar11 = vfmadd231sd_avx512f(auVar31,auVar27,auVar15);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1 * dVar2;
  auVar15 = vsubsd_avx512f(auVar9,auVar22);
  auVar9 = vaddsd_avx512f(auVar22,auVar9);
  auVar15 = vaddsd_avx512f(auVar15,auVar15);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = auVar16._0_8_ + auVar16._0_8_;
  auVar13 = vfmadd213sd_avx512f(auVar24,auVar29,auVar13);
  auVar11 = vfmadd213sd_avx512f(auVar15,auVar29,auVar11);
  auVar10 = vsubsd_avx512f(auVar10,auVar12);
  local_40.m_data[0] = auVar13._0_8_;
  vmovsd_avx512f(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar4 * (auVar9._0_8_ + auVar9._0_8_);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = auVar10._0_8_ + auVar10._0_8_;
  auVar11 = vfmadd231sd_fma(auVar12,auVar27,auVar9);
  auVar11 = vfmadd213sd_fma(auVar14,auVar29,auVar11);
  local_40.m_data[2] = auVar11._0_8_;
  auVar11._0_8_ = -dVar30;
  auVar11._8_8_ = -auVar5._8_8_;
  auVar18 = *(undefined1 (*) [32])(this->coord).rot.m_data;
  dVar1 = (this->coord).rot.m_data[1];
  auVar25._24_8_ = dVar1;
  auVar25._16_8_ = dVar1;
  auVar7 = vpermpd_avx2(*(undefined1 (*) [32])((this->coord).rot.m_data + 2),0x15);
  auVar19 = vpermpd_avx2(auVar18,1);
  auVar26._0_8_ = auVar19._0_8_ * auVar8._0_8_;
  auVar26._8_8_ = auVar19._8_8_ * auVar8._8_8_;
  auVar26._16_8_ = auVar19._16_8_ * dVar30;
  auVar26._24_8_ = auVar19._24_8_ * auVar5._8_8_;
  auVar5 = vfmadd231pd_fma(auVar26,auVar17,auVar18);
  dVar1 = (this->coord).rot.m_data[2];
  auVar25._8_8_ = dVar1;
  auVar25._0_8_ = dVar1;
  auVar18._16_16_ = auVar32;
  auVar18._0_16_ = auVar11;
  auVar18 = vpermpd_avx2(auVar18,0x24);
  auVar5 = vfmadd213pd_fma(auVar25,auVar18,ZEXT1632(auVar5));
  auVar19._16_16_ = auVar20;
  auVar19._0_16_ = auVar11;
  auVar18 = vpermpd_avx2(auVar21,0x66);
  auVar18 = vshufpd_avx(auVar19,auVar18,9);
  auVar5 = vfmadd213pd_fma(auVar18,auVar7,ZEXT1632(auVar5));
  local_28.m_data = (double  [4])ZEXT1632(auVar5);
  SetCoord(this,&local_40,&local_28);
  return this;
}

Assistant:

ChFrame<Real>& operator>>=(const ChQuaternion<Real>& R) {
        this->SetCoord(R.Rotate(this->coord.pos), this->coord.rot >> R);
        return *this;
    }